

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3ExprAttachSubtrees(sqlite3 *db,Expr *pRoot,Expr *pLeft,Expr *pRight)

{
  sqlite3 *in_RCX;
  long in_RDX;
  long in_RSI;
  Expr *in_stack_ffffffffffffffd8;
  
  if (in_RSI == 0) {
    sqlite3ExprDelete(in_RCX,in_stack_ffffffffffffffd8);
    sqlite3ExprDelete(in_RCX,in_stack_ffffffffffffffd8);
  }
  else {
    if (in_RCX == (sqlite3 *)0x0) {
      *(undefined4 *)(in_RSI + 0x28) = 1;
    }
    else {
      *(sqlite3 **)(in_RSI + 0x18) = in_RCX;
      *(uint *)(in_RSI + 4) = *(uint *)((long)&in_RCX->pVfs + 4) & 0x400208 | *(uint *)(in_RSI + 4);
      *(int *)(in_RSI + 0x28) = in_RCX->nDb + 1;
    }
    if (in_RDX != 0) {
      *(long *)(in_RSI + 0x10) = in_RDX;
      *(uint *)(in_RSI + 4) = *(uint *)(in_RDX + 4) & 0x400208 | *(uint *)(in_RSI + 4);
      if (*(int *)(in_RSI + 0x28) <= *(int *)(in_RDX + 0x28)) {
        *(int *)(in_RSI + 0x28) = *(int *)(in_RDX + 0x28) + 1;
      }
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprAttachSubtrees(
  sqlite3 *db,
  Expr *pRoot,
  Expr *pLeft,
  Expr *pRight
){
  if( pRoot==0 ){
    assert( db->mallocFailed );
    sqlite3ExprDelete(db, pLeft);
    sqlite3ExprDelete(db, pRight);
  }else{
    assert( ExprUseXList(pRoot) );
    assert( pRoot->x.pSelect==0 );
    if( pRight ){
      pRoot->pRight = pRight;
      pRoot->flags |= EP_Propagate & pRight->flags;
#if SQLITE_MAX_EXPR_DEPTH>0
      pRoot->nHeight = pRight->nHeight+1;
    }else{
      pRoot->nHeight = 1;
#endif
    }
    if( pLeft ){
      pRoot->pLeft = pLeft;
      pRoot->flags |= EP_Propagate & pLeft->flags;
#if SQLITE_MAX_EXPR_DEPTH>0
      if( pLeft->nHeight>=pRoot->nHeight ){
        pRoot->nHeight = pLeft->nHeight+1;
      }
#endif
    }
  }
}